

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O0

timestamp_t
duckdb::TryCastDecimalCInternal<duckdb::timestamp_t>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  timestamp_t result_value;
  idx_t in_stack_00000060;
  idx_t in_stack_00000068;
  timestamp_t *in_stack_00000070;
  duckdb_result *in_stack_00000078;
  undefined8 local_28;
  undefined8 local_8;
  
  bVar1 = CastDecimalCInternal<duckdb::timestamp_t>
                    (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    local_8 = FetchDefaultValue::Operation<duckdb::timestamp_t>();
  }
  return (timestamp_t)local_8;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}